

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::ReadBinID(BamStandardIndex *this,uint32_t *binId)

{
  uint uVar1;
  IBamIODevice *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  string local_68;
  string local_48;
  
  pIVar2 = (this->m_resources).Device;
  iVar3 = (*pIVar2->_vptr_IBamIODevice[5])(pIVar2,binId,4);
  if (this->m_isBigEndian == true) {
    uVar1 = *binId;
    *binId = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  if (CONCAT44(extraout_var,iVar3) == 4) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamStandardIndex::ReadBinID","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not read BAI bin ID","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadBinID(uint32_t& binId)
{
    const int64_t numBytesRead = m_resources.Device->Read((char*)&binId, sizeof(binId));
    if (m_isBigEndian) SwapEndian_32(binId);
    if (numBytesRead != sizeof(binId))
        throw BamException("BamStandardIndex::ReadBinID", "could not read BAI bin ID");
}